

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::RestrictedLogSoftmax::dim_forward
          (RestrictedLogSoftmax *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  bool bVar1;
  size_type sVar2;
  ostream *ds;
  invalid_argument *this_00;
  const_reference __src;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  ostringstream s;
  Dim *in_stack_fffffffffffffe18;
  Dim *os;
  string local_1b8 [48];
  ostringstream local_188 [376];
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  os = in_RDI;
  local_10 = in_RDX;
  sVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar2 != 1) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes-common.cc"
                  ,0x266,
                  "virtual Dim cnn::RestrictedLogSoftmax::dim_forward(const vector<Dim> &) const");
  }
  std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
  bVar1 = LooksLikeVector(in_stack_fffffffffffffe18);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    ds = std::operator<<((ostream *)local_188,"Bad input dimensions in RestrictedLogSoftmax: ");
    cnn::operator<<((ostream *)os,(vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)ds);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(this_00,local_1b8);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __src = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
  memcpy(os,__src,0x24);
  return in_RDI;
}

Assistant:

Dim RestrictedLogSoftmax::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() == 1);
  if (!LooksLikeVector(xs[0])) {
    ostringstream s; s << "Bad input dimensions in RestrictedLogSoftmax: " << xs;
    throw std::invalid_argument(s.str());
  }
  return xs[0];
}